

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::sectionStarting(XmlReporter *this,SectionInfo *sectionInfo)

{
  int iVar1;
  XmlWriter *pXVar2;
  allocator local_b9;
  string local_b8 [32];
  Catch local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  SectionInfo *local_18;
  SectionInfo *sectionInfo_local;
  XmlReporter *this_local;
  
  local_18 = sectionInfo;
  sectionInfo_local = (SectionInfo *)this;
  StreamingReporterBase::sectionStarting(&this->super_StreamingReporterBase,sectionInfo);
  iVar1 = this->m_sectionDepth;
  this->m_sectionDepth = iVar1 + 1;
  if (0 < iVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Section",&local_39);
    pXVar2 = XmlWriter::startElement(&this->m_xml,(string *)local_38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"name",&local_71);
    trim(local_98,&local_18->name);
    pXVar2 = XmlWriter::writeAttribute(pXVar2,(string *)local_70,(string *)local_98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"description",&local_b9);
    XmlWriter::writeAttribute(pXVar2,(string *)local_b8,&local_18->description);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return;
}

Assistant:

virtual void sectionStarting(SectionInfo const& sectionInfo) CATCH_OVERRIDE {
			StreamingReporterBase::sectionStarting(sectionInfo);
			if (m_sectionDepth++ > 0) {
				m_xml.startElement("Section")
					.writeAttribute("name", trim(sectionInfo.name))
					.writeAttribute("description", sectionInfo.description);
			}
		}